

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

SmallBuffer *
helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,complex<double> *val)

{
  value_t vVar1;
  char *pcVar2;
  json_value __n;
  string *val_00;
  reference pvVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  json_value jVar5;
  long lVar6;
  double dVar7;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> vectorVal;
  json jsonArray;
  json json;
  json_value local_a8;
  json_value jStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  double local_88;
  data local_80;
  json_value local_70;
  json_value local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  double local_50;
  data local_48;
  data local_30;
  
  jVar5 = (json_value)((json_value *)(val->_M_value + 8))->number_float;
  if ((jVar5.number_float == 0.0) && (!NAN(jVar5.number_float))) {
    typeConvert(__return_storage_ptr__,type,*(double *)val->_M_value);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsComplexString_abi_cxx11_
              ((string *)&local_a8,(helics *)CONCAT44(in_register_00000034,type),
               *(double *)val->_M_value,jVar5.number_float);
    local_70 = jStack_a0;
    local_68.string = local_a8.string;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_70)
    ;
    local_60._M_allocated_capacity = local_98._M_allocated_capacity;
    jVar5 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.object == &local_98) {
      return __return_storage_ptr__;
    }
    goto LAB_0027a96c;
  case HELICS_DOUBLE:
    local_a8.number_float = cabs(*(double *)val->_M_value);
    ValueConverter<double>::convert(__return_storage_ptr__,&local_a8.number_float);
    break;
  case HELICS_INT:
    dVar7 = cabs(*(double *)val->_M_value);
    local_a8.number_integer = (long)dVar7;
    goto LAB_0027aa2b;
  case HELICS_VECTOR:
    local_70 = *(json_value *)val->_M_value;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_70;
    local_68 = jVar5;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_a8,__l,(allocator_type *)&local_80)
    ;
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.object ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return __return_storage_ptr__;
    }
    uVar4 = local_98._M_allocated_capacity - (long)local_a8;
    jVar5 = local_a8;
    goto LAB_0027a9b6;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,val,1);
    break;
  case HELICS_NAMED_POINT:
    helicsComplexString_abi_cxx11_
              ((string *)&local_70,(helics *)CONCAT44(in_register_00000034,type),
               *(double *)val->_M_value,jVar5.number_float);
    jVar5 = local_70;
    lVar6 = (long)&(local_68.object)->_M_t + (long)local_70.object;
    local_50 = nan("0");
    local_a8.object = (object_t *)&local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,jVar5.object,lVar6);
    local_88 = local_50;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&local_a8);
    if (local_a8.object != (object_t *)&local_98) {
      operator_delete(local_a8.object,local_98._M_allocated_capacity + 1);
    }
    jVar5 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.object == &local_60) {
      return __return_storage_ptr__;
    }
LAB_0027a96c:
    uVar4 = local_60._M_allocated_capacity + 1;
LAB_0027a9b6:
    operator_delete(jVar5.object,uVar4);
    break;
  case HELICS_BOOL:
    dVar7 = cabs(*(double *)val->_M_value);
    pcVar2 = "+0";
    if (dVar7 != 0.0) {
      pcVar2 = "*1";
    }
    if (NAN(dVar7)) {
      pcVar2 = "*1";
    }
    jStack_a0.object = (object_t *)(pcVar2 + 1);
    local_a8.number_integer = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_a8)
    ;
    break;
  case HELICS_TIME:
    dVar7 = cabs(*(double *)val->_M_value);
    if (dVar7 <= -9223372036.854765) {
      local_a8.number_integer = -0x7fffffffffffffff;
    }
    else {
      local_a8.number_integer = 0x7fffffffffffffff;
      if (dVar7 < 9223372036.854765) {
        local_a8.number_integer =
             (number_integer_t)
             (dVar7 * 1000000000.0 +
             *(double *)(&DAT_0040a540 + (ulong)(0.0 <= dVar7 * 1000000000.0) * 8));
      }
    }
LAB_0027aa2b:
    ValueConverter<long>::convert(__return_storage_ptr__,&local_a8.number_integer);
    break;
  default:
    if (type == HELICS_JSON) {
      local_70.number_unsigned = local_70.number_unsigned & 0xffffffffffffff00;
      local_68.object = (object_t *)0x0;
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_COMPLEX);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_30,val_00);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_70.boolean,"type");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_30.m_type;
      jVar5 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_30.m_value;
      local_30.m_type = vVar1;
      local_30.m_value = jVar5;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_30);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_80,(initializer_list_t)ZEXT816(0),false,array);
      local_a8.object = (object_t *)0x0;
      jStack_a0.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_a8,*(number_float_t *)val->_M_value);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_80,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_a8);
      local_a8.object = (object_t *)0x0;
      jStack_a0.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_a8,*(number_float_t *)(val->_M_value + 8));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_80,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_a8);
      local_48.m_type = local_80.m_type;
      local_48._1_7_ = local_80._1_7_;
      local_48.m_value = local_80.m_value;
      local_80.m_type = null;
      local_80.m_value.object = (object_t *)0x0;
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_70.boolean,"value");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_48.m_type;
      local_48.m_type = vVar1;
      jVar5 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_48.m_value;
      local_48.m_value = jVar5;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      fileops::generateJsonString((string *)&local_a8,(json *)&local_70,true);
      __n = jStack_a0;
      jVar5 = local_a8;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,jStack_a0.number_unsigned);
      __return_storage_ptr__->bufferSize = (size_t)__n;
      memcpy(__return_storage_ptr__->heap,jVar5.object,__n.number_unsigned);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.object != &local_98) {
        operator_delete(local_a8.object,local_98._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_80);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_70);
      return __return_storage_ptr__;
    }
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,val);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const std::complex<double>& val)
{
    if (val.imag() == 0.0) {
        return typeConvert(type, val.real());
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(std::abs(val));
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(std::abs(val)));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(std::abs(val)).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
        default:
            return ValueConverter<std::complex<double>>::convert(val);
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((std::abs(val) != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsComplexString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsComplexString(val), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
            return ValueConverter<std::complex<double>>::convert(&val, 1);
        case DataType::HELICS_VECTOR: {
            const std::vector<double> vectorVal{val.real(), val.imag()};
            return ValueConverter<std::vector<double>>::convert(vectorVal);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_COMPLEX);
            nlohmann::json jsonArray = nlohmann::json::array();
            jsonArray.push_back(val.real());
            jsonArray.push_back(val.imag());
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}